

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

lua_State * lj_state_newstate(lua_Alloc f,void *ud)

{
  int iVar1;
  GG_State *GG;
  uint32_t uVar2;
  GG_State *pGVar3;
  
  GG = (GG_State *)(*f)(ud,(void *)0x0,0,0x15a8);
  pGVar3 = (GG_State *)0x0;
  if ((ulong)GG >> 0x20 == 0 && GG != (GG_State *)0x0) {
    memset(GG,0,0x15a8);
    (GG->L).marked = 'a';
    (GG->L).gct = '\x06';
    (GG->L).dummy_ffid = '\x01';
    (GG->L).glref.ptr32 = (uint32_t)&GG->g;
    (GG->g).gc.currentwhite = '!';
    (GG->g).strempty.marked = '\x01';
    (GG->g).strempty.gct = '\x04';
    (GG->g).allocf = f;
    (GG->g).allocd = ud;
    uVar2 = (uint32_t)GG;
    (GG->g).mainthref.gcptr32 = uVar2;
    (GG->g).uvhead.field_5.field_1.prev.gcptr32 = uVar2 + 0x188;
    (GG->g).uvhead.field_5.field_1.next.gcptr32 = uVar2 + 0x188;
    (GG->g).strmask = 0xffffffff;
    *(undefined4 *)(((ulong)&GG->g & 0xffffffff) + 0x11c) = 0xffffffff;
    (GG->g).nilnode.val.field_2.it = 0xffffffff;
    (GG->g).nilnode.key.field_2.it = 0xffffffff;
    (GG->g).nilnode.freetop.ptr32 = uVar2 + 0x170;
    (GG->g).gc.state = '\0';
    (GG->g).tmpbuf.p = 0;
    (GG->g).tmpbuf.e = 0;
    (GG->g).tmpbuf.b = 0;
    (GG->g).tmpbuf.L = 0;
    (GG->g).gc.root.gcptr32 = uVar2;
    (GG->g).gc.sweep.ptr32 = uVar2 + 0xa0;
    (GG->g).gc.total = 0x15a8;
    (GG->g).gc.allocated = 0x15a8;
    (GG->g).gc.stepmul = 200;
    (GG->g).gc.pause = 200;
    lj_dispatch_init(GG);
    (GG->L).status = '\x06';
    iVar1 = lj_vm_cpcall(GG,0,0,cpluaopen);
    if (iVar1 == 0) {
      (GG->L).status = '\0';
      pGVar3 = GG;
    }
    else {
      close_state((lua_State *)GG);
      pGVar3 = (GG_State *)0x0;
    }
  }
  return &pGVar3->L;
}

Assistant:

lua_State *lj_state_newstate(lua_Alloc f, void *ud)
#else
LUA_API lua_State *lua_newstate(lua_Alloc f, void *ud)
#endif
{
  GG_State *GG = (GG_State *)f(ud, NULL, 0, sizeof(GG_State));
  lua_State *L = &GG->L;
  global_State *g = &GG->g;
  if (GG == NULL || !checkptrGC(GG)) return NULL;
  memset(GG, 0, sizeof(GG_State));
  L->gct = ~LJ_TTHREAD;
  L->marked = LJ_GC_WHITE0 | LJ_GC_FIXED | LJ_GC_SFIXED;  /* Prevent free. */
  L->dummy_ffid = FF_C;
  setmref(L->glref, g);
  g->gc.currentwhite = LJ_GC_WHITE0 | LJ_GC_FIXED;
  g->strempty.marked = LJ_GC_WHITE0;
  g->strempty.gct = ~LJ_TSTR;
  g->allocf = f;
  g->allocd = ud;
  setgcref(g->mainthref, obj2gco(L));
  setgcref(g->uvhead.prev, obj2gco(&g->uvhead));
  setgcref(g->uvhead.next, obj2gco(&g->uvhead));
  g->strmask = ~(MSize)0;
  setnilV(registry(L));
  setnilV(&g->nilnode.val);
  setnilV(&g->nilnode.key);
#if !LJ_GC64
  setmref(g->nilnode.freetop, &g->nilnode);
#endif
  lj_buf_init(NULL, &g->tmpbuf);
  g->gc.state = GCSpause;
  setgcref(g->gc.root, obj2gco(L));
  setmref(g->gc.sweep, &g->gc.root);
  g->gc.allocated = g->gc.total = sizeof(GG_State);
  g->gc.pause = LUAI_GCPAUSE;
  g->gc.stepmul = LUAI_GCMUL;
  lj_dispatch_init((GG_State *)L);
  L->status = LUA_ERRERR+1;  /* Avoid touching the stack upon memory error. */
  if (lj_vm_cpcall(L, NULL, NULL, cpluaopen) != 0) {
    /* Memory allocation error: free partial state. */
    close_state(L);
    return NULL;
  }
  L->status = LUA_OK;
  return L;
}